

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void ParseHTMLWithNode(TidyDocImpl *doc,Node *node)

{
  int iVar1;
  TidyParserMemory *pTVar2;
  Parser *pPVar3;
  long lVar4;
  GetTokenMode mode;
  
  pPVar3 = GetParserForNode((TidyDocImpl *)doc->lexer,(Node *)(doc->config).value[0x67].p);
  mode = IgnoreWhitespace;
LAB_00137df0:
  if (pPVar3 == (Parser *)0x0) {
LAB_00137e1d:
    iVar1 = (doc->stack).top;
    lVar4 = (long)iVar1;
    if (-1 < lVar4) goto code_r0x00137e29;
    goto LAB_00137e54;
  }
  node = (*pPVar3)(doc,node,mode);
  if (node == (Node *)0x0) goto LAB_00137e1d;
  goto LAB_00137e05;
code_r0x00137e29:
  pTVar2 = (doc->stack).content;
  pPVar3 = pTVar2[lVar4].identity;
  node = (Node *)0x0;
  if (pPVar3 == (Parser *)0x0) {
    mode = pTVar2[lVar4].mode;
    (doc->stack).top = iVar1 + -1;
LAB_00137e54:
    node = prvTidyGetToken(doc,mode);
    if (node == (Node *)0x0) {
      return;
    }
LAB_00137e05:
    pPVar3 = GetParserForNode((TidyDocImpl *)doc->lexer,(Node *)(doc->config).value[0x67].p);
  }
  goto LAB_00137df0;
}

Assistant:

void ParseHTMLWithNode( TidyDocImpl* doc, Node* node )
{
    GetTokenMode mode = IgnoreWhitespace;
    Parser* parser = GetParserForNode( doc, node );
    Bool something_to_do = yes;

    /*
     This main loop is only extinguished when all of the parser tokens are
     consumed. Ideally, EVERY parser will return nodes to this loop for
     dispatch to the appropriate parser, but some of the recursive parsers
     still consume some tokens on their own.
     */
    while (something_to_do)
    {
        node = parser ? parser( doc, node, mode ) : NULL;
        
        /*
         We have a node, so anything deferred was already pushed to the stack
         to be dealt with later.
         */
        if ( node )
        {
            parser = GetParserForNode( doc, node );
            continue;
        }

        /*
         We weren't given a node, which means this particular leaf is bottomed
         out. We'll re-enter the parsers using information from the stack.
         */
        if ( !TY_(isEmptyParserStack)(doc))
        {
            parser = TY_(peekMemoryIdentity)(doc);
            if (parser)
            {
                continue;
            }
            else
            {
                /* No parser means we're only passing back a parsing mode. */
                mode = TY_(peekMemoryMode)( doc );
                TY_(popMemory)( doc );
            }
        }
        
        /*
         At this point, there's nothing being returned from parsers, and
         nothing on the stack, so we can draw a new node from the lexer.
         */
        node = TY_(GetToken)( doc, mode );
        DEBUG_LOG_GOT_TOKEN(node);

        if (node)
            parser = GetParserForNode( doc, node );
        else
            something_to_do = no;
    }
}